

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

int __thiscall presolve::HPresolve::link(HPresolve *this,char *__from,char *__to)

{
  HighsVarType HVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  int *piVar13;
  int iVar14;
  HighsInt y;
  long lVar15;
  int *piVar16;
  HighsInt Nleft;
  int local_48;
  int local_44;
  pointer local_40;
  int *local_38;
  
  piVar16 = &local_48;
  iVar11 = (int)__from;
  piVar7 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5[iVar11] = piVar4[piVar7[iVar11]];
  piVar12 = (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar12[iVar11] = -1;
  piVar4[piVar7[iVar11]] = iVar11;
  lVar9 = (long)piVar5[iVar11];
  if (lVar9 != -1) {
    piVar12[lVar9] = iVar11;
  }
  piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + piVar7[iVar11];
  *piVar8 = *piVar8 + 1;
  piVar4 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4[iVar11] = -1;
  piVar5 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = piVar5 + iVar11;
  *piVar8 = -1;
  piVar12 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar6 = (this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = piVar12[iVar11];
  iVar14 = piVar6[iVar2];
  if (iVar14 != -1) {
    iVar10 = piVar7[iVar11];
    piVar13 = &local_44;
    local_44 = -1;
    local_48 = -1;
    local_40 = piVar12;
    local_38 = piVar8;
    do {
      lVar9 = (long)iVar14;
      if (iVar10 < piVar7[lVar9]) {
        iVar3 = piVar4[lVar9];
        lVar15 = (long)iVar3;
        if (lVar15 == -1) {
          iVar10 = -1;
          goto LAB_00305af5;
        }
        if (iVar10 < piVar7[lVar15]) {
          piVar4[lVar9] = piVar5[lVar15];
          piVar5[lVar15] = iVar14;
          lVar9 = lVar15;
          iVar14 = iVar3;
          if (piVar4[lVar15] == -1) goto LAB_00305ae4;
        }
        *piVar13 = iVar14;
        piVar8 = piVar4 + lVar9;
        piVar13 = piVar8;
      }
      else {
        if (iVar10 <= piVar7[lVar9]) goto LAB_00305ae4;
        iVar3 = piVar5[lVar9];
        lVar15 = (long)iVar3;
        if (lVar15 == -1) goto LAB_00305ae4;
        if (piVar7[lVar15] < iVar10) {
          piVar5[lVar9] = piVar4[lVar15];
          piVar4[lVar15] = iVar14;
          lVar9 = lVar15;
          iVar14 = iVar3;
          if (piVar5[lVar15] == -1) goto LAB_00305ae4;
        }
        *piVar16 = iVar14;
        piVar8 = piVar5 + lVar9;
        piVar16 = piVar8;
      }
      iVar14 = *piVar8;
    } while( true );
  }
  piVar4[iVar11] = -1;
LAB_00305b51:
  *piVar8 = -1;
  piVar6[iVar2] = iVar11;
  HighsLinearSumBounds::add
            (&this->impliedRowBounds,piVar12[iVar11],piVar7[iVar11],
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar11]);
  HighsLinearSumBounds::add
            (&this->impliedDualRowBounds,
             (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar11],
             (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar11],
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar11]);
  piVar7 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar16 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start + piVar7[iVar11];
  *piVar16 = *piVar16 + 1;
  HVar1 = (this->model->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start
          [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[iVar11]];
  if (HVar1 == kInteger) {
    lVar9 = 0x118;
  }
  else {
    if (HVar1 != kImplicitInteger) goto LAB_00305be8;
    lVar9 = 0x130;
  }
  piVar7 = (pointer)(long)piVar7[iVar11];
  piVar16 = (int *)(*(long *)((long)&this->model + lVar9) + (long)piVar7 * 4);
  *piVar16 = *piVar16 + 1;
LAB_00305be8:
  return (int)piVar7;
LAB_00305ae4:
  iVar10 = piVar4[lVar9];
LAB_00305af5:
  *piVar16 = iVar10;
  *piVar13 = piVar5[lVar9];
  piVar4[lVar9] = local_48;
  piVar5[lVar9] = local_44;
  piVar6[iVar2] = iVar14;
  piVar12 = local_40;
  if (piVar7[iVar11] < piVar7[lVar9]) {
    piVar4[iVar11] = piVar4[lVar9];
    iVar14 = piVar6[iVar2];
    *local_38 = iVar14;
    piVar8 = piVar4 + iVar14;
  }
  else {
    piVar5[iVar11] = piVar5[lVar9];
    iVar14 = piVar6[iVar2];
    piVar4[iVar11] = iVar14;
    piVar8 = piVar5 + iVar14;
  }
  goto LAB_00305b51;
}

Assistant:

void HPresolve::link(HighsInt pos) {
  Anext[pos] = colhead[Acol[pos]];
  Aprev[pos] = -1;
  colhead[Acol[pos]] = pos;
  if (Anext[pos] != -1) Aprev[Anext[pos]] = pos;

  ++colsize[Acol[pos]];

  ARleft[pos] = -1;
  ARright[pos] = -1;
  auto get_row_left = [&](HighsInt pos) -> HighsInt& { return ARleft[pos]; };
  auto get_row_right = [&](HighsInt pos) -> HighsInt& { return ARright[pos]; };
  auto get_row_key = [&](HighsInt pos) { return Acol[pos]; };
  highs_splay_link(pos, rowroot[Arow[pos]], get_row_left, get_row_right,
                   get_row_key);

  impliedRowBounds.add(Arow[pos], Acol[pos], Avalue[pos]);
  impliedDualRowBounds.add(Acol[pos], Arow[pos], Avalue[pos]);
  ++rowsize[Arow[pos]];
  if (model->integrality_[Acol[pos]] == HighsVarType::kInteger)
    ++rowsizeInteger[Arow[pos]];
  else if (model->integrality_[Acol[pos]] == HighsVarType::kImplicitInteger)
    ++rowsizeImplInt[Arow[pos]];
}